

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_b7c4f::JsonBoolean::JsonBoolean(JsonBoolean *this)

{
  Json::Json(&this->super_Json);
  (this->super_Json).super_Test._vptr_Test = (_func_int **)&PTR__JsonBoolean_001aade0;
  testing::StrictMock<mock_json_callbacks>::StrictMock(&this->callbacks_);
  (this->proxy_).original_ = &(this->callbacks_).super_mock_json_callbacks;
  return;
}

Assistant:

JsonBoolean ()
                : proxy_{callbacks_} {}